

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void R_RebuildViewInterpolation(player_t *player)

{
  bool bVar1;
  AActor *actor;
  InterpolationViewer *pIVar2;
  InterpolationViewer *iview;
  player_t *player_local;
  
  if (((player != (player_t *)0x0) &&
      (bVar1 = TObjPtr<AActor>::operator==(&player->camera,(AActor *)0x0), !bVar1)) &&
     ((NoInterpolateView & 1U) != 0)) {
    NoInterpolateView = false;
    actor = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&player->camera);
    pIVar2 = FindPastViewer(actor);
    InterpolationViewer::instance::operator=(&pIVar2->Old,&pIVar2->New);
    TArray<DVector3a,_DVector3a>::Clear(&InterpolationPath);
  }
  return;
}

Assistant:

void R_RebuildViewInterpolation(player_t *player)
{
	if (player == NULL || player->camera == NULL)
		return;

	if (!NoInterpolateView)
		return;
	NoInterpolateView = false;

	InterpolationViewer *iview = FindPastViewer(player->camera);

	iview->Old = iview->New;
	InterpolationPath.Clear();
}